

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O3

void __thiscall
DepfileParserTestMultipleRulesTolerateMP::~DepfileParserTestMultipleRulesTolerateMP
          (DepfileParserTestMultipleRulesTolerateMP *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pSVar3;
  
  (this->super_DepfileParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DepfileParserTest_001d2980;
  pcVar2 = (this->super_DepfileParserTest).input_._M_dataplus._M_p;
  paVar1 = &(this->super_DepfileParserTest).input_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pSVar3 = (this->super_DepfileParserTest).parser_.ins_.
           super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar3 != (pointer)0x0) {
    operator_delete(pSVar3,(long)(this->super_DepfileParserTest).parser_.ins_.
                                 super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3);
  }
  pSVar3 = (this->super_DepfileParserTest).parser_.outs_.
           super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar3 != (pointer)0x0) {
    operator_delete(pSVar3,(long)(this->super_DepfileParserTest).parser_.outs_.
                                 super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3);
  }
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(DepfileParserTest, MultipleRulesTolerateMP) {
  string err;
  EXPECT_TRUE(Parse("foo: x\n"
                    "x:\n"
                    "foo: y\n"
                    "y:\n"
                    "foo: z\n"
                    "z:\n", &err));
  ASSERT_EQ(1u, parser_.outs_.size());
  ASSERT_EQ("foo", parser_.outs_[0].AsString());
  ASSERT_EQ(3u, parser_.ins_.size());
  EXPECT_EQ("x", parser_.ins_[0].AsString());
  EXPECT_EQ("y", parser_.ins_[1].AsString());
  EXPECT_EQ("z", parser_.ins_[2].AsString());
}